

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O2

int testFileWriterTestsWriteToFile(void)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  uint uVar4;
  size_type __n;
  SpanSize<18446744073709551615UL> in_R8;
  pointer ptVar5;
  float *__first2;
  uchar *puVar6;
  SpanSize<18446744073709551615UL> SVar7;
  float *__first1;
  uchar *puVar8;
  long lVar9;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  initializer_list<unsigned_char> __l_00;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  initializer_list<float> __l_01;
  Span<const_unsigned_char,_18446744073709551615UL> data_01;
  initializer_list<unsigned_char> __l_02;
  Span<unsigned_char,_18446744073709551615UL> data_02;
  Span<unsigned_char,_18446744073709551615UL> data_03;
  Span<float,_18446744073709551615UL> data_04;
  Span<unsigned_char,_18446744073709551615UL> data_05;
  allocator_type local_2a9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> oldExpected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outputOld;
  AutoDeleteTempFile tempfile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x281e140a);
  __l._M_len = 4;
  __l._M_array = (iterator)&output;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&expected,__l,(allocator_type *)&oldExpected);
  SVar7.m_size = (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  puVar8 = (uchar *)0x0;
  if (SVar7.m_size != 0) {
    puVar8 = expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  uVar4 = 1;
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)&output,psVar2,true);
  data.m_size.m_size = SVar7.m_size;
  data.m_ptr = puVar8;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)&output,data,0);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)&output);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&output,(long)expected.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)expected.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(allocator_type *)&oldExpected);
  ptVar5 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  puVar6 = (uchar *)0x0;
  if (ptVar5 != (pointer)0x0) {
    puVar6 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  data_02.m_size.m_size = in_R8.m_size;
  data_02.m_ptr = ptVar5;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar2,(string *)0x0,(uint64_t)puVar6,data_02);
  bVar1 = std::__equal4<unsigned_char_const*,unsigned_char*>
                    (puVar8,puVar8 + SVar7.m_size,puVar6,ptVar5 + (long)puVar6);
  if (bVar1) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x281e140a);
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&output;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&expected,__l_00,(allocator_type *)&oldExpected);
    SVar7.m_size = (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
    puVar8 = (uchar *)0x0;
    if (SVar7.m_size != 0) {
      puVar8 = expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
    MILBlob::Blob::FileWriter::FileWriter((FileWriter *)&output,psVar2,false);
    data_00.m_size.m_size = SVar7.m_size;
    data_00.m_ptr = puVar8;
    MILBlob::Blob::FileWriter::WriteData((FileWriter *)&output,data_00,0);
    MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)&output);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&output,(long)expected.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)expected.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(allocator_type *)&oldExpected
              );
    ptVar5 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start;
    puVar6 = (uchar *)0x0;
    if (ptVar5 != (pointer)0x0) {
      puVar6 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
    data_03.m_size.m_size = in_R8.m_size;
    data_03.m_ptr = ptVar5;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar2,(string *)0x0,(uint64_t)puVar6,data_03);
    bVar1 = std::__equal4<unsigned_char_const*,unsigned_char*>
                      (puVar8,puVar8 + SVar7.m_size,puVar6,ptVar5 + (long)puVar6);
    if (bVar1) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x40b591683f9e147b;
      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x445eda3d44208000;
      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0x465cb08f;
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)&output;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&expected,__l_01,
                 (allocator_type *)&oldExpected);
      SVar7.m_size = (long)expected.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)expected.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      __first1 = (float *)0x0;
      if (SVar7.m_size != 0) {
        __first1 = (float *)expected.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
      }
      psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
      MILBlob::Blob::FileWriter::FileWriter((FileWriter *)&output,psVar2,false);
      data_01.m_size.m_size = SVar7.m_size;
      data_01.m_ptr = (pointer)__first1;
      MILBlob::Blob::FileWriter::WriteData((FileWriter *)&output,data_01,0x40);
      MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)&output);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&output,
                 (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&oldExpected)
      ;
      lVar9 = (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start;
      __first2 = (float *)0x0;
      if (lVar9 != 0) {
        __first2 = (float *)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      }
      psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
      data_04.m_ptr = (pointer)(lVar9 >> 2);
      data_04.m_size.m_size = in_R8.m_size;
      MILBlob::TestUtil::ReadBlobFile<float>
                ((TestUtil *)psVar2,(string *)0x40,(uint64_t)__first2,data_04);
      bVar1 = std::__equal4<float_const*,float*>
                        (__first1,(float *)(SVar7.m_size + (long)__first1),__first2,
                         (float *)(lVar9 + (long)__first2));
      if (bVar1) {
        outputOld.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x281e140a;
        __l_02._M_len = 4;
        __l_02._M_array = (iterator)&outputOld;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&oldExpected,__l_02,&local_2a9);
        __n = (long)oldExpected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)oldExpected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        puVar8 = (uchar *)0x0;
        if (__n != 0) {
          puVar8 = oldExpected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&outputOld,__n,&local_2a9);
        ptVar5 = outputOld.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish +
                 -(long)CONCAT44(outputOld.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 outputOld.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
        puVar6 = (uchar *)0x0;
        if (ptVar5 != (pointer)0x0) {
          puVar6 = (uchar *)CONCAT44(outputOld.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     outputOld.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
        }
        psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
        data_05.m_size.m_size = in_R8.m_size;
        data_05.m_ptr = ptVar5;
        MILBlob::TestUtil::ReadBlobFile<unsigned_char>
                  ((TestUtil *)psVar2,(string *)0x0,(uint64_t)puVar6,data_05);
        bVar1 = std::__equal4<unsigned_char_const*,unsigned_char*>
                          (puVar8,puVar8 + __n,puVar6,ptVar5 + (long)puVar6);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x5f);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,
                                   "std::equal(oldExpectedSpan.begin(), oldExpectedSpan.end(), outputOldSpan.begin(), outputOldSpan.end())"
                                  );
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&outputOld.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&oldExpected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        uVar4 = (uint)!bVar1;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x57);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,
                                 "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                                );
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar3);
        uVar4 = 1;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&output);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&expected);
      goto LAB_00172843;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x48);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,
                             "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                            );
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x39);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,
                             "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                            );
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_00172843:
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return uVar4;
}

Assistant:

int testFileWriterTestsWriteToFile()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to empty file without truncating
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to existing file without truncating
    {
        uint64_t offset = 64;
        const std::vector<float> expected{1.235f, 5.674f, 642.f, 891.41f, 14124.14f};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<float> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<float>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Ensure earlier written data is present as well
        const std::vector<uint8_t> oldExpected{10, 20, 30, 40};
        auto oldExpectedSpan = Util::MakeSpan(oldExpected);
        std::vector<uint8_t> outputOld(oldExpected.size());
        auto outputOldSpan = Util::MakeSpan(outputOld);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputOldSpan);
        ML_ASSERT_SPAN_EQ(oldExpectedSpan, outputOldSpan);
    }

    return 0;
}